

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O0

Element __thiscall ftxui::text(ftxui *this,wstring *text)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Element EVar1;
  string local_48;
  undefined1 local_28 [24];
  wstring *text_local;
  
  local_28._16_8_ = text;
  text_local = (wstring *)this;
  to_string(&local_48,text);
  std::make_shared<ftxui::(anonymous_namespace)::Text,std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_28);
  std::shared_ptr<ftxui::Node>::shared_ptr<ftxui::(anonymous_namespace)::Text,void>
            ((shared_ptr<ftxui::Node> *)this,
             (shared_ptr<ftxui::(anonymous_namespace)::Text> *)local_28);
  std::shared_ptr<ftxui::(anonymous_namespace)::Text>::~shared_ptr
            ((shared_ptr<ftxui::(anonymous_namespace)::Text> *)local_28);
  std::__cxx11::string::~string((string *)&local_48);
  EVar1.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar1.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Element)EVar1.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Element text(std::wstring text) {  // NOLINT
  return std::make_shared<Text>(to_string(text));
}